

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2BigCountedRepetition(void)

{
  bool bVar1;
  string s;
  RE2 re;
  char *local_2a8;
  undefined8 local_2a0;
  char local_298 [16];
  Options local_288;
  LogMessage local_270;
  RE2 local_f0;
  
  local_288.encoding_ = EncodingUTF8;
  local_288.posix_syntax_ = false;
  local_288.longest_match_ = false;
  local_288.log_errors_ = true;
  local_288.literal_ = false;
  local_288.never_nl_ = false;
  local_288.dot_nl_ = false;
  local_288.never_capture_ = false;
  local_288.case_sensitive_ = true;
  local_288.perl_classes_ = false;
  local_288.word_boundary_ = false;
  local_288.one_line_ = false;
  local_288.max_mem_ = 0x10000000;
  local_270._0_8_ = ".{512}x";
  local_270._8_4_ = 7;
  RE2::RE2(&local_f0,(StringPiece *)&local_270,&local_288);
  if (local_f0.error_code_ != NoError) {
    LogMessage::LogMessage
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4b3,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_270 + 8),"Check failed: re.ok()",0x15);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_270);
  }
  local_2a0 = 0;
  local_298[0] = '\0';
  local_2a8 = local_298;
  std::__cxx11::string::_M_replace_aux((ulong)&local_2a8,0,0,'\x03');
  std::__cxx11::string::append((char *)&local_2a8);
  local_270._0_8_ = local_2a8;
  local_270._8_4_ = (int)local_2a0;
  bVar1 = RE2::PartialMatchN((StringPiece *)&local_270,&local_f0,(Arg **)0x0,0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4b7,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_270 + 8),"Check failed: RE2::PartialMatch(s, re)",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_270);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  RE2::~RE2(&local_f0);
  return;
}

Assistant:

TEST(RE2, BigCountedRepetition) {
  // Test that counted repetition works, given tons of memory.
  RE2::Options opt;
  opt.set_max_mem(256<<20);

  RE2 re(".{512}x", opt);
  CHECK(re.ok());
  string s;
  s.append(515, 'c');
  s.append("x");
  CHECK(RE2::PartialMatch(s, re));
}